

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

SourceCodeInfo_Location * __thiscall
google::protobuf::SourceCodeInfo_Location::New(SourceCodeInfo_Location *this,Arena *arena)

{
  SourceCodeInfo_Location *this_00;
  
  this_00 = (SourceCodeInfo_Location *)operator_new(0x70);
  SourceCodeInfo_Location(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::SourceCodeInfo_Location>(arena,this_00);
  }
  return this_00;
}

Assistant:

SourceCodeInfo_Location* SourceCodeInfo_Location::New(::google::protobuf::Arena* arena) const {
  SourceCodeInfo_Location* n = new SourceCodeInfo_Location;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}